

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

uint64_t __thiscall relive::LogManager::symbolicThreadId(LogManager *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict2 *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  key_type local_18;
  
  local_18._M_thread = pthread_self();
  p_Var1 = &(this->_symbolicThreadIds)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->_symbolicThreadIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_18._M_thread]) {
    if (*(ulong *)(p_Var4 + 1) >= local_18._M_thread) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, local_18._M_thread < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    p_Var4 = (_Base_ptr)(this->_symbolicThreadIds)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pmVar2 = std::
             map<std::thread::id,_unsigned_long,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
             ::operator[](&this->_symbolicThreadIds,&local_18);
    *pmVar2 = (mapped_type_conflict2)p_Var4;
  }
  else {
    p_Var4 = p_Var4[1]._M_parent;
  }
  return (uint64_t)p_Var4;
}

Assistant:

uint64_t LogManager::symbolicThreadId()
{
    uint64_t symId = 0;
    auto sti = _symbolicThreadIds.find(std::this_thread::get_id());
    if (sti != _symbolicThreadIds.end()) {
        symId = sti->second;
    }
    else {
        symId = _symbolicThreadIds.size();
        _symbolicThreadIds[std::this_thread::get_id()] = symId;
    }
    return symId;
}